

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O2

sysbvm_chunkedAllocatorChunk_t *
sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity
          (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment)

{
  _Bool _Var1;
  sysbvm_chunkedAllocatorChunk_t *psVar2;
  void *pvVar3;
  sysbvm_chunkedAllocatorChunk_s *psVar4;
  byte bVar5;
  sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping;
  sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping;
  
  psVar2 = allocator->currentChunk;
  while (psVar2 != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    if (((size + alignment) - 1 & -alignment) <=
        psVar2->capacity - (psVar2->size + (alignment - 1) & -alignment)) {
      return psVar2;
    }
    psVar2 = psVar2->next;
    allocator->currentChunk = psVar2;
  }
  newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t *)0x0;
  newChunkExecutableMapping = (sysbvm_chunkedAllocatorChunk_t *)0x0;
  if (allocator->requiresExecutableMapping == true) {
    _Var1 = sysbvm_virtualMemory_hasSupportForRWXMapping();
    if (_Var1) {
      newChunkWriteableMapping =
           (sysbvm_chunkedAllocatorChunk_t *)
           sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
      newChunkWriteableMapping->capacity = 0;
      newChunkWriteableMapping->size = 0;
      newChunkWriteableMapping->dualMappingHandle = (void *)0x0;
      newChunkWriteableMapping->reserved = (void *)0x0;
      newChunkWriteableMapping->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      psVar4 = newChunkWriteableMapping;
      newChunkExecutableMapping = newChunkWriteableMapping;
    }
    else {
      pvVar3 = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping
                         (allocator->chunkSize,&newChunkWriteableMapping,&newChunkExecutableMapping)
      ;
      newChunkWriteableMapping->dualMappingHandle = (void *)0x0;
      newChunkWriteableMapping->reserved = (void *)0x0;
      newChunkWriteableMapping->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      newChunkWriteableMapping->capacity = 0;
      newChunkWriteableMapping->size = 0;
      newChunkWriteableMapping->dualMappingHandle = pvVar3;
      psVar4 = newChunkExecutableMapping;
    }
  }
  else {
    newChunkWriteableMapping =
         (sysbvm_chunkedAllocatorChunk_t *)
         sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
    newChunkWriteableMapping->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    newChunkWriteableMapping->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    newChunkWriteableMapping->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    newChunkWriteableMapping->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    newChunkWriteableMapping->dualMappingHandle = (void *)0x0;
    newChunkWriteableMapping->reserved = (void *)0x0;
    newChunkWriteableMapping->capacity = 0;
    newChunkWriteableMapping->size = 0;
    psVar4 = (sysbvm_chunkedAllocatorChunk_s *)0x0;
  }
  newChunkWriteableMapping->capacity = allocator->chunkSize - 0x40;
  newChunkWriteableMapping->writeableMapping = newChunkWriteableMapping;
  newChunkWriteableMapping->executableMapping = psVar4;
  if (allocator->firstChunk == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    allocator->firstChunk = newChunkWriteableMapping;
  }
  psVar2 = allocator->lastChunk;
  if (psVar2 != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    bVar5 = allocator->requiresExecutableMapping;
    if ((_Bool)bVar5 == true) {
      _Var1 = sysbvm_virtualMemory_lockCodePagesForWriting
                        (psVar2->writeableMapping,psVar2->executableMapping,0x40);
      if (!_Var1) {
        abort();
      }
      psVar2 = allocator->lastChunk;
      bVar5 = allocator->requiresExecutableMapping;
    }
    psVar2->next = newChunkWriteableMapping;
    newChunkWriteableMapping->previous = psVar2;
    if ((bVar5 & 1) != 0) {
      sysbvm_virtualMemory_unlockCodePagesForExecution
                (psVar2->writeableMapping,psVar2->executableMapping,0x40);
    }
  }
  allocator->lastChunk = newChunkWriteableMapping;
  allocator->currentChunk = newChunkWriteableMapping;
  return newChunkWriteableMapping;
}

Assistant:

static sysbvm_chunkedAllocatorChunk_t *sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment)
{
    sysbvm_chunkedAllocatorChunk_t **currentChunk = &allocator->currentChunk;

    // Advance the current chunk.
    size_t requiredAlignedSize = sysbvm_chunkedAllocator_sizeAlignedTo(size, alignment);
    while(*currentChunk && ((*currentChunk)->capacity - sysbvm_chunkedAllocator_sizeAlignedTo((*currentChunk)->size, alignment)) < requiredAlignedSize)
        *currentChunk = (*currentChunk)->next;

    // Create a new chunk if needed
    if(*currentChunk == NULL)
    {
        sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping = NULL;
        sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping = NULL;

        if(allocator->requiresExecutableMapping)
        {
            if(sysbvm_virtualMemory_hasSupportForRWXMapping())
            {
                newChunkExecutableMapping = newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
            }
            else
            {
                void *handle = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping(allocator->chunkSize, (void**)&newChunkWriteableMapping, (void**)&newChunkExecutableMapping);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
                newChunkWriteableMapping->dualMappingHandle = handle;
            }
        }
        else
        {
            newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
            memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        
        newChunkWriteableMapping->capacity = allocator->chunkSize - sizeof(sysbvm_chunkedAllocatorChunk_t);
        newChunkWriteableMapping->writeableMapping = newChunkWriteableMapping;
        newChunkWriteableMapping->executableMapping = newChunkExecutableMapping;

        if(!allocator->firstChunk)
            allocator->firstChunk = newChunkWriteableMapping;

        if(allocator->lastChunk)
        {
            if(allocator->requiresExecutableMapping &&
                !sysbvm_virtualMemory_lockCodePagesForWriting(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t)))
                abort();

            allocator->lastChunk->next = newChunkWriteableMapping;
            newChunkWriteableMapping->previous = allocator->lastChunk;

            if(allocator->requiresExecutableMapping)
                sysbvm_virtualMemory_unlockCodePagesForExecution(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        allocator->lastChunk = newChunkWriteableMapping;

        *currentChunk = newChunkWriteableMapping;
    }

    return *currentChunk;

}